

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

string * __thiscall
Datetime::monthName_abi_cxx11_(string *__return_storage_ptr__,Datetime *this,int month)

{
  reference input;
  int iVar1;
  int month_local;
  
  iVar1 = (int)this;
  if (iVar1 < 1) {
    __assert_fail("month > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GothenburgBitFactory[P]libshared/src/Datetime.cpp"
                  ,0xdbb,"static std::string Datetime::monthName(int)");
  }
  if (iVar1 < 0xd) {
    input = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&monthNames_abi_cxx11_,(long)(iVar1 + -1));
    upperCaseFirst(__return_storage_ptr__,input);
    return __return_storage_ptr__;
  }
  __assert_fail("month <= 12",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GothenburgBitFactory[P]libshared/src/Datetime.cpp"
                ,0xdbc,"static std::string Datetime::monthName(int)");
}

Assistant:

std::string Datetime::monthName (int month)
{
  assert (month > 0);
  assert (month <= 12);
  return upperCaseFirst (monthNames[month - 1]);
}